

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O2

Attribute * __thiscall Imf_2_5::Attribute::newAttribute(Attribute *this,char *typeName)

{
  iterator iVar1;
  Attribute *pAVar2;
  ostream *poVar3;
  ArgExc *this_00;
  Lock local_1b0;
  char *typeName_local;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  typeName_local = (char *)this;
  anon_unknown_0::typeMap();
  local_1b0._mutex = &anon_unknown_0::typeMap::tMap.mutex;
  std::mutex::lock(&anon_unknown_0::typeMap::tMap.mutex);
  local_1b0._locked = true;
  iVar1 = std::
          map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
          ::find((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                  *)&typeName_local,(key_type *)typeName);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header) {
    pAVar2 = (Attribute *)(*(code *)iVar1._M_node[1]._M_parent)();
    IlmThread_2_5::Lock::~Lock(&local_1b0);
    return pAVar2;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar3 = std::operator<<(local_188,"Cannot create image file attribute of unknown type \"");
  poVar3 = std::operator<<(poVar3,(char *)this);
  std::operator<<(poVar3,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

Attribute *
Attribute::newAttribute (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    TypeMap::const_iterator i = tMap.find (typeName);

    if (i == tMap.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot create image file attribute of "
			    "unknown type \"" << typeName << "\".");

    return (i->second)();
}